

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TZX.cpp
# Opt level: O2

void __thiscall Storage::Tape::TZX::get_standard_speed_data_block(TZX *this)

{
  FileHolder *this_00;
  uint8_t uVar1;
  uint16_t uVar2;
  DataBlock data_block;
  
  data_block.length_of_pilot_pulse = 0x878;
  data_block.length_of_sync_first_pulse = 0x29b;
  data_block.length_of_sync_second_pulse = 0x2df;
  data_block.data.length_of_zero_bit_pulse = 0x357;
  data_block.data.length_of_one_bit_pulse = 0x6ae;
  data_block.data.number_of_bits_in_final_byte = 8;
  this_00 = &this->file_;
  uVar2 = FileHolder::get16le(this_00);
  data_block.data.pause_after_block = (uint)uVar2;
  uVar2 = FileHolder::get16le(this_00);
  data_block.data.data_length = (uint32_t)uVar2;
  if (uVar2 != 0) {
    uVar1 = FileHolder::get8(this_00);
    data_block.length_of_pilot_tone = 0xc97;
    if (-1 < (char)uVar1) {
      data_block.length_of_pilot_tone = 0x1f7f;
    }
    FileHolder::seek(this_00,-1,1);
    get_data_block(this,&data_block);
  }
  return;
}

Assistant:

void TZX::get_standard_speed_data_block() {
	DataBlock data_block;
	data_block.length_of_pilot_pulse = 2168;
	data_block.length_of_sync_first_pulse = 667;
	data_block.length_of_sync_second_pulse = 735;
	data_block.data.length_of_zero_bit_pulse = 855;
	data_block.data.length_of_one_bit_pulse = 1710;
	data_block.data.number_of_bits_in_final_byte = 8;

	data_block.data.pause_after_block = file_.get16le();
	data_block.data.data_length = file_.get16le();
	if(!data_block.data.data_length) return;

	uint8_t first_byte = file_.get8();
	data_block.length_of_pilot_tone = (first_byte < 128) ? 8063 : 3223;
	file_.seek(-1, SEEK_CUR);

	get_data_block(data_block);
}